

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_> *this,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  double local_20;
  
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>).super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>.
    super_TPZGeoEl = &PTR__TPZSavable_0173c8a8;
  TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>,&PTR_PTR_0173be30,id,nodeindexes,
             matind,mesh);
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>).super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>.
    super_TPZGeoEl = &PTR__TPZGeoElMapped_0173bb20;
  local_20 = 0.0;
  TPZFNMatrix<8,_double>::TPZFNMatrix(&this->fCornerCo,2,4,&local_20);
  return;
}

Assistant:

TPZGeoElMapped(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
	TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(id,nodeindexes,matind,mesh), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}